

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_wait_for_sync(rtr_socket *rtr_socket)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined1 auStack_10058 [8];
  int iStack_10050;
  undefined4 uStack_1004c;
  pdu_type pStack_10048;
  int iStack_10044;
  pdu_type type;
  int rtval;
  time_t wait;
  rtr_socket *prStack_10030;
  rtr_socket *rtr_socket_local;
  long lStack_10020;
  time_t cur_time;
  char pdu [65535];
  
  wait = (time_t)auStack_10058;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prStack_10030 = rtr_socket;
  lrtr_get_monotonic_time(&lStack_10020);
  _type = (prStack_10030->last_update + (ulong)prStack_10030->refresh_interval) - lStack_10020;
  if (_type < 0) {
    _type = 0;
  }
  lrtr_dbg("RTR Socket: waiting %jd sec. till next sync",_type);
  iStack_10044 = rtr_receive_pdu(prStack_10030,&cur_time,0xffff,_type);
  if (iStack_10044 < 0) {
    if (iStack_10044 == -2) {
      lrtr_dbg("RTR Socket: Refresh interval expired");
      rtr_socket_local._4_4_ = 0;
      goto LAB_0010e13d;
    }
  }
  else {
    pStack_10048 = rtr_get_pdu_type(&cur_time);
    if (pStack_10048 == SERIAL_NOTIFY) {
      lrtr_dbg("RTR Socket: Serial Notify received (%u)",(ulong)(uint)pdu._0_4_);
      rtr_socket_local._4_4_ = 0;
      goto LAB_0010e13d;
    }
  }
  rtr_socket_local._4_4_ = -1;
LAB_0010e13d:
  uStack_1004c = 1;
  iStack_10050 = rtr_socket_local._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    *(undefined8 *)(wait + -8) = 0x10e179;
    __stack_chk_fail();
  }
  return rtr_socket_local._4_4_;
}

Assistant:

int rtr_wait_for_sync(struct rtr_socket *rtr_socket)
{
	char pdu[RTR_MAX_PDU_LEN];

	time_t cur_time;

	lrtr_get_monotonic_time(&cur_time);
	time_t wait = (rtr_socket->last_update + rtr_socket->refresh_interval) - cur_time;

	if (wait < 0)
		wait = 0;

	RTR_DBG("waiting %jd sec. till next sync", (intmax_t)wait);
	const int rtval = rtr_receive_pdu(rtr_socket, pdu, sizeof(pdu), wait);

	if (rtval >= 0) {
		enum pdu_type type = rtr_get_pdu_type(pdu);

		if (type == SERIAL_NOTIFY) {
			RTR_DBG("Serial Notify received (%u)", ((struct pdu_serial_notify *)pdu)->sn);
			return RTR_SUCCESS;
		}
	} else if (rtval == TR_WOULDBLOCK) {
		RTR_DBG1("Refresh interval expired");
		return RTR_SUCCESS;
	}
	return RTR_ERROR;
}